

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O2

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_loadblockindex::test_method
          (chainstatemanager_loadblockindex *this)

{
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *this_00;
  long lVar1;
  ChainstateManager *this_01;
  pointer ppCVar2;
  uint256 *puVar3;
  base_blob<256U> *pbVar4;
  CBlockIndex *pCVar5;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar6;
  Chainstate *pCVar7;
  Chainstate *pCVar8;
  CBlockIndex *pCVar9;
  int nHeight;
  iterator pvVar10;
  iterator pvVar11;
  int *piVar12;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *pUVar13;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  int local_f4;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  anon_class_8_1_3d09f077 reload_all_block_indexes;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  CBlockIndex *assumed_tip;
  CBlockIndex *assumed_base;
  CBlockIndex *validated_tip;
  int num_indexes;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar6 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                      ,0x1a8,"test_method","m_node.chainman");
  this_01 = (puVar6->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  pCVar7 = ChainstateManager::ActiveChainstate(this_01);
  num_indexes = 0;
  TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,0x14);
  validated_tip = (CBlockIndex *)0x0;
  assumed_base = (CBlockIndex *)0x0;
  pvVar10 = (iterator)0x1b8;
  pvVar11 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock41,&cs_main,"chainman.GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x1b8,false);
  pCVar8 = ChainstateManager::ActiveChainstate(this_01);
  ppCVar2 = (pCVar8->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar8->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar9 = (CBlockIndex *)0x0;
  }
  else {
    pCVar9 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock41.super_unique_lock);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar11;
  msg.m_begin = pvVar10;
  file.m_end = (iterator)0x1b9;
  file.m_begin = (iterator)&local_98;
  assumed_tip = pCVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a8,msg);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_b0 = "";
  piVar12 = &pCVar9->nHeight;
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock46.super_unique_lock._M_device._4_4_,0x78);
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&criticalblock41,&local_b8,0x1b9,1,2,piVar12,"assumed_tip->nHeight",&criticalblock46,
             "120");
  reload_all_block_indexes.chainman = this_01;
  test_method::anon_class_8_1_3d09f077::operator()(&reload_all_block_indexes);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)piVar12;
  msg_00.m_begin = pvVar10;
  file_00.m_end = (iterator)0x1cc;
  file_00.m_begin = (iterator)&local_d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e0,msg_00
            );
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_e8 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       (pCVar7->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_f4 = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_f0,0x1cc,1,2,&criticalblock46,
             "cs1.setBlockIndexCandidates.size()",&local_f4,"1");
  for (nHeight = 0;
      nHeight < (int)((ulong)((long)(pCVar7->m_chain).vChain.
                                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pCVar7->m_chain).vChain.
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      nHeight = nHeight + 1) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               &criticalblock41.super_unique_lock,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
               ,0x1d0,false);
    pCVar9 = CChain::operator[](&pCVar7->m_chain,nHeight);
    if (nHeight - 0x5bU < 0x14) {
      pCVar9->nStatus = 2;
      pCVar9->nTx = 0;
      pCVar9->m_chain_tx_count = 0;
    }
    num_indexes = num_indexes + 1;
    pCVar5 = pCVar9;
    if ((nHeight != 0x6e) && (pCVar5 = assumed_base, nHeight == 0x5a)) {
      validated_tip = pCVar9;
    }
    assumed_base = pCVar5;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock41.super_unique_lock);
  }
  pvVar10 = (iterator)0x1e8;
  pvVar11 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock46,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
             ,0x1e8,false);
  pCVar9 = assumed_base;
  puVar3 = assumed_base->phashBlock;
  criticalblock41.super_unique_lock._M_device =
       *(mutex_type **)(puVar3->super_base_blob<256U>).m_data._M_elems;
  pbVar4 = &puVar3->super_base_blob<256U>;
  criticalblock41.super_unique_lock._M_owns = (bool)(pbVar4->m_data)._M_elems[8];
  criticalblock41.super_unique_lock._9_1_ = (pbVar4->m_data)._M_elems[9];
  criticalblock41.super_unique_lock._10_1_ = (pbVar4->m_data)._M_elems[10];
  criticalblock41.super_unique_lock._11_1_ = (pbVar4->m_data)._M_elems[0xb];
  criticalblock41.super_unique_lock._12_1_ = (pbVar4->m_data)._M_elems[0xc];
  criticalblock41.super_unique_lock._13_1_ = (pbVar4->m_data)._M_elems[0xd];
  criticalblock41.super_unique_lock._14_1_ = (pbVar4->m_data)._M_elems[0xe];
  criticalblock41.super_unique_lock._15_1_ = (pbVar4->m_data)._M_elems[0xf];
  pCVar8 = ChainstateManager::ActivateExistingSnapshot
                     (this_01,(base_blob<256U>)
                              *(base_blob<256U> *)(puVar3->super_base_blob<256U>).m_data._M_elems);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock46.super_unique_lock);
  CChain::SetTip(&pCVar7->m_chain,validated_tip);
  CChain::SetTip(&pCVar8->m_chain,pCVar9);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  file_01.m_end = (iterator)0x1f1;
  file_01.m_begin = (iterator)&local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
             msg_01);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_120 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock46.super_unique_lock._M_device._4_4_,0x79);
  pvVar10 = (iterator)0x2;
  piVar12 = &num_indexes;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&criticalblock41,&local_128,0x1f1,1,2,piVar12,"num_indexes",
             &criticalblock46.super_unique_lock,"121");
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)piVar12;
  msg_02.m_begin = pvVar10;
  file_02.m_end = (iterator)0x1f2;
  file_02.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_148,
             msg_02);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_150 = "";
  piVar12 = &assumed_tip->nHeight;
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock46.super_unique_lock._M_device._4_4_,0x78);
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&criticalblock41,&local_158,0x1f2,1,2,piVar12,"assumed_tip->nHeight",
             &criticalblock46.super_unique_lock,"120");
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)piVar12;
  msg_03.m_begin = pvVar10;
  file_03.m_end = (iterator)0x1f3;
  file_03.m_begin = (iterator)&local_168;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_178,
             msg_03);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_180 = "";
  piVar12 = &validated_tip->nHeight;
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock46.super_unique_lock._M_device._4_4_,0x5a);
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&criticalblock41,&local_188,499,1,2,piVar12,"validated_tip->nHeight",
             &criticalblock46.super_unique_lock,"90");
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)piVar12;
  msg_04.m_begin = pvVar10;
  file_04.m_end = (iterator)0x1f4;
  file_04.m_begin = (iterator)&local_198;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1a8,
             msg_04);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1b0 = "";
  piVar12 = &pCVar9->nHeight;
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock46.super_unique_lock._M_device._4_4_,0x6e);
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&criticalblock41,&local_1b8,500,1,2,piVar12,"assumed_base->nHeight",
             &criticalblock46.super_unique_lock,"110");
  test_method::anon_class_8_1_3d09f077::operator()(&reload_all_block_indexes);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)piVar12;
  msg_05.m_begin = pvVar10;
  file_05.m_end = (iterator)0x20e;
  file_05.m_begin = (iterator)&local_1c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1d8,
             msg_05);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1e0 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       (pCVar7->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pUVar13 = &criticalblock46;
  local_f4 = 2;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_1e8,0x20e,1,2,pUVar13,"cs1.setBlockIndexCandidates.size()",
             &local_f4,"2");
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pUVar13;
  msg_06.m_begin = pvVar10;
  file_06.m_end = (iterator)0x20f;
  file_06.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_208,
             msg_06);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_210 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
       count(&pCVar7->setBlockIndexCandidates,&validated_tip);
  pUVar13 = &criticalblock46;
  local_f4 = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_218,0x20f,1,2,pUVar13,
             "cs1.setBlockIndexCandidates.count(validated_tip)",&local_f4,"1");
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pUVar13;
  msg_07.m_begin = pvVar10;
  file_07.m_end = (iterator)0x210;
  file_07.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_238,
             msg_07);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_240 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
       count(&pCVar7->setBlockIndexCandidates,&assumed_base);
  pUVar13 = &criticalblock46;
  local_f4 = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_248,0x210,1,2,pUVar13,
             "cs1.setBlockIndexCandidates.count(assumed_base)",&local_f4,"1");
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)pUVar13;
  msg_08.m_begin = pvVar10;
  file_08.m_end = (iterator)0x220;
  file_08.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_268,
             msg_08);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_270 = "";
  this_00 = &pCVar8->setBlockIndexCandidates;
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
       count(this_00,&validated_tip);
  pUVar13 = &criticalblock46;
  local_f4 = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_278,0x220,1,2,pUVar13,
             "cs2.setBlockIndexCandidates.count(validated_tip)",&local_f4,"0");
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pUVar13;
  msg_09.m_begin = pvVar10;
  file_09.m_end = (iterator)0x222;
  file_09.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_298,
             msg_09);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2a0 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
       count(this_00,&assumed_base->pprev);
  pUVar13 = &criticalblock46;
  local_f4 = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_2a8,0x222,1,2,pUVar13,
             "cs2.setBlockIndexCandidates.count(assumed_base->pprev)",&local_f4,"0");
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pUVar13;
  msg_10.m_begin = pvVar10;
  file_10.m_end = (iterator)0x224;
  file_10.m_begin = (iterator)&local_2b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2c8,
             msg_10);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d0 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
       count(this_00,&assumed_base);
  pUVar13 = &criticalblock46;
  local_f4 = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_2d8,0x224,1,2,pUVar13,
             "cs2.setBlockIndexCandidates.count(assumed_base)",&local_f4,"1");
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)pUVar13;
  msg_11.m_begin = pvVar10;
  file_11.m_end = (iterator)0x226;
  file_11.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2f8,
             msg_11);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_300 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
       count(this_00,&assumed_tip);
  pUVar13 = &criticalblock46;
  local_f4 = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_308,0x226,1,2,pUVar13,
             "cs2.setBlockIndexCandidates.count(assumed_tip)",&local_f4,"1");
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pUVar13;
  msg_12.m_begin = pvVar10;
  file_12.m_end = (iterator)0x228;
  file_12.m_begin = (iterator)&local_318;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_328,
             msg_12);
  criticalblock41.super_unique_lock._8_8_ =
       criticalblock41.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock41.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_330 = "";
  criticalblock46.super_unique_lock._M_device =
       (mutex_type *)
       (pCVar8->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_f4 = num_indexes + -0x6e;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&criticalblock41,&local_338,0x228,1,2,&criticalblock46,
             "cs2.setBlockIndexCandidates.size()",&local_f4,
             "num_indexes - last_assumed_valid_idx + 1");
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_loadblockindex, TestChain100Setup)
{
    ChainstateManager& chainman = *Assert(m_node.chainman);
    Chainstate& cs1 = chainman.ActiveChainstate();

    int num_indexes{0};
    // Blocks in range [assumed_valid_start_idx, last_assumed_valid_idx) will be
    // marked as assumed-valid and not having data.
    const int expected_assumed_valid{20};
    const int last_assumed_valid_idx{111};
    const int assumed_valid_start_idx = last_assumed_valid_idx - expected_assumed_valid;

    // Mine to height 120, past the hardcoded regtest assumeutxo snapshot at
    // height 110
    mineBlocks(20);

    CBlockIndex* validated_tip{nullptr};
    CBlockIndex* assumed_base{nullptr};
    CBlockIndex* assumed_tip{WITH_LOCK(chainman.GetMutex(), return chainman.ActiveChain().Tip())};
    BOOST_CHECK_EQUAL(assumed_tip->nHeight, 120);

    auto reload_all_block_indexes = [&]() {
        // For completeness, we also reset the block sequence counters to
        // ensure that no state which affects the ranking of tip-candidates is
        // retained (even though this isn't strictly necessary).
        WITH_LOCK(::cs_main, return chainman.ResetBlockSequenceCounters());
        for (Chainstate* cs : chainman.GetAll()) {
            LOCK(::cs_main);
            cs->ClearBlockIndexCandidates();
            BOOST_CHECK(cs->setBlockIndexCandidates.empty());
        }

        WITH_LOCK(::cs_main, chainman.LoadBlockIndex());
    };

    // Ensure that without any assumed-valid BlockIndex entries, only the current tip is
    // considered as a candidate.
    reload_all_block_indexes();
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.size(), 1);

    // Reset some region of the chain's nStatus, removing the HAVE_DATA flag.
    for (int i = 0; i <= cs1.m_chain.Height(); ++i) {
        LOCK(::cs_main);
        auto index = cs1.m_chain[i];

        // Blocks with heights in range [91, 110] are marked as missing data.
        if (i < last_assumed_valid_idx && i >= assumed_valid_start_idx) {
            index->nStatus = BlockStatus::BLOCK_VALID_TREE;
            index->nTx = 0;
            index->m_chain_tx_count = 0;
        }

        ++num_indexes;

        // Note the last fully-validated block as the expected validated tip.
        if (i == (assumed_valid_start_idx - 1)) {
            validated_tip = index;
        }
        // Note the last assumed valid block as the snapshot base
        if (i == last_assumed_valid_idx - 1) {
            assumed_base = index;
        }
    }

    // Note: cs2's tip is not set when ActivateExistingSnapshot is called.
    Chainstate& cs2 = WITH_LOCK(::cs_main,
        return chainman.ActivateExistingSnapshot(*assumed_base->phashBlock));

    // Set tip of the fully validated chain to be the validated tip
    cs1.m_chain.SetTip(*validated_tip);

    // Set tip of the assume-valid-based chain to the assume-valid block
    cs2.m_chain.SetTip(*assumed_base);

    // Sanity check test variables.
    BOOST_CHECK_EQUAL(num_indexes, 121); // 121 total blocks, including genesis
    BOOST_CHECK_EQUAL(assumed_tip->nHeight, 120);  // original chain has height 120
    BOOST_CHECK_EQUAL(validated_tip->nHeight, 90); // current cs1 chain has height 90
    BOOST_CHECK_EQUAL(assumed_base->nHeight, 110); // current cs2 chain has height 110

    // Regenerate cs1.setBlockIndexCandidates and cs2.setBlockIndexCandidate and
    // check contents below.
    reload_all_block_indexes();

    // The fully validated chain should only have the current validated tip and
    // the assumed valid base as candidates, blocks 90 and 110. Specifically:
    //
    // - It does not have blocks 0-89 because they contain less work than the
    //   chain tip.
    //
    // - It has block 90 because it has data and equal work to the chain tip,
    //   (since it is the chain tip).
    //
    // - It does not have blocks 91-109 because they do not contain data.
    //
    // - It has block 110 even though it does not have data, because
    //   LoadBlockIndex has a special case to always add the snapshot block as a
    //   candidate. The special case is only actually intended to apply to the
    //   snapshot chainstate cs2, not the background chainstate cs1, but it is
    //   written broadly and applies to both.
    //
    // - It does not have any blocks after height 110 because cs1 is a background
    //   chainstate, and only blocks where are ancestors of the snapshot block
    //   are added as candidates for the background chainstate.
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.size(), 2);
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.count(validated_tip), 1);
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.count(assumed_base), 1);

    // The assumed-valid tolerant chain has the assumed valid base as a
    // candidate, but otherwise has none of the assumed-valid (which do not
    // HAVE_DATA) blocks as candidates.
    //
    // Specifically:
    // - All blocks below height 110 are not candidates, because cs2 chain tip
    //   has height 110 and they have less work than it does.
    //
    // - Block 110 is a candidate even though it does not have data, because it
    //   is the snapshot block, which is assumed valid.
    //
    // - Blocks 111-120 are added because they have data.

    // Check that block 90 is absent
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(validated_tip), 0);
    // Check that block 109 is absent
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_base->pprev), 0);
    // Check that block 110 is present
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_base), 1);
    // Check that block 120 is present
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_tip), 1);
    // Check that 11 blocks total are present.
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.size(), num_indexes - last_assumed_valid_idx + 1);
}